

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  byte bVar1;
  string *psVar2;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 != 0) {
    this->ctype_ = 0;
    *(undefined4 *)((long)&this->ctype_ + 3) = 0;
    if (((bVar1 & 0x10) != 0) &&
       (psVar2 = this->experimental_map_key_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)
       ) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    this->weak_ = false;
  }
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
  this->_has_bits_[0] = 0;
  UnknownFieldSet::Clear(&this->_unknown_fields_);
  return;
}

Assistant:

void FieldOptions::Clear() {
  _extensions_.Clear();
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    ctype_ = 0;
    packed_ = false;
    lazy_ = false;
    deprecated_ = false;
    if (has_experimental_map_key()) {
      if (experimental_map_key_ != &::google::protobuf::internal::kEmptyString) {
        experimental_map_key_->clear();
      }
    }
    weak_ = false;
  }
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}